

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_decoder.c
# Opt level: O3

lzma_ret lzma_simple_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  int iVar1;
  int *ptr;
  lzma_ret lVar2;
  
  lVar2 = LZMA_OK;
  if (props_size != 0) {
    if (props_size == 4) {
      ptr = (int *)lzma_alloc(4,allocator);
      if (ptr == (int *)0x0) {
        lVar2 = LZMA_MEM_ERROR;
      }
      else {
        iVar1 = *(int *)props;
        *ptr = iVar1;
        lVar2 = LZMA_OK;
        if (iVar1 == 0) {
          lzma_free(ptr,allocator);
        }
        else {
          *options = ptr;
        }
      }
    }
    else {
      lVar2 = LZMA_OPTIONS_ERROR;
    }
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_simple_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size == 0)
		return LZMA_OK;

	if (props_size != 4)
		return LZMA_OPTIONS_ERROR;

	lzma_options_bcj *opt = lzma_alloc(
			sizeof(lzma_options_bcj), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	opt->start_offset = read32le(props);

	// Don't leave an options structure allocated if start_offset is zero.
	if (opt->start_offset == 0)
		lzma_free(opt, allocator);
	else
		*options = opt;

	return LZMA_OK;
}